

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_ArgsInDifferentPositions_Test::~FormatterTest_ArgsInDifferentPositions_Test
          (FormatterTest_ArgsInDifferentPositions_Test *this)

{
  void *in_RDI;
  
  ~FormatterTest_ArgsInDifferentPositions_Test
            ((FormatterTest_ArgsInDifferentPositions_Test *)0x19f4d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatterTest, ArgsInDifferentPositions) {
  EXPECT_EQ("42", format("{0}", 42));
  EXPECT_EQ("before 42", format("before {0}", 42));
  EXPECT_EQ("42 after", format("{0} after", 42));
  EXPECT_EQ("before 42 after", format("before {0} after", 42));
  EXPECT_EQ("answer = 42", format("{0} = {1}", "answer", 42));
  EXPECT_EQ("42 is the answer", format("{1} is the {0}", "answer", 42));
  EXPECT_EQ("abracadabra", format("{0}{1}{0}", "abra", "cad"));
}